

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mad.cpp
# Opt level: O2

bool __thiscall duckdb::FrameSet::Contains(FrameSet *this,idx_t i)

{
  vector<duckdb::FrameBounds,_true> *this_00;
  ulong uVar1;
  const_reference pvVar2;
  ulong __n;
  ulong uVar3;
  
  uVar1 = 0;
  do {
    __n = uVar1;
    this_00 = this->frames;
    uVar3 = (long)(this_00->super_vector<duckdb::FrameBounds,_std::allocator<duckdb::FrameBounds>_>)
                  .super__Vector_base<duckdb::FrameBounds,_std::allocator<duckdb::FrameBounds>_>.
                  _M_impl.super__Vector_impl_data._M_finish -
            (long)(this_00->super_vector<duckdb::FrameBounds,_std::allocator<duckdb::FrameBounds>_>)
                  .super__Vector_base<duckdb::FrameBounds,_std::allocator<duckdb::FrameBounds>_>.
                  _M_impl.super__Vector_impl_data._M_start >> 4;
    if (uVar3 <= __n) break;
    pvVar2 = vector<duckdb::FrameBounds,_true>::get<true>(this_00,__n);
    uVar1 = __n + 1;
  } while ((i < pvVar2->start) || (pvVar2->end <= i));
  return __n < uVar3;
}

Assistant:

inline bool Contains(idx_t i) const {
		for (idx_t f = 0; f < frames.size(); ++f) {
			const auto &frame = frames[f];
			if (frame.start <= i && i < frame.end) {
				return true;
			}
		}
		return false;
	}